

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# neon_helper.c
# Opt level: O0

uint32_t helper_neon_qshl_s32_arm(CPUARMState *env,uint32_t arg1,uint32_t arg2)

{
  byte bVar1;
  anon_union_4_2_9473010e conv_u_2;
  int8_t tmp;
  anon_union_4_2_9473010e conv_u_1;
  anon_union_4_2_9473010e conv_u;
  neon_s32 vdest;
  neon_s32 vsrc2;
  neon_s32 vsrc1;
  uint32_t res;
  uint32_t arg2_local;
  uint32_t arg1_local;
  CPUARMState *env_local;
  
  bVar1 = (byte)arg2;
  if ((char)bVar1 < ' ') {
    if ((char)bVar1 < -0x1f) {
      conv_u_1.i = arg1 >> 0x1f;
    }
    else if ((char)bVar1 < '\0') {
      conv_u_1.i = arg1 >> (-bVar1 & 0x1f);
    }
    else {
      conv_u_1.i = arg1 << (bVar1 & 0x1f);
      if (conv_u_1.i >> (bVar1 & 0x1f) != arg1) {
        (env->vfp).qc[0] = 1;
        conv_u_1.i = 0x80000000;
        if (0 < (int)arg1) {
          conv_u_1.i = 0x7fffffff;
        }
      }
    }
  }
  else if (arg1 == 0) {
    conv_u_1.i = 0;
  }
  else {
    (env->vfp).qc[0] = 1;
    conv_u_1.i = 0x80000000;
    if (0 < (int)arg1) {
      conv_u_1.i = 0x7fffffff;
    }
  }
  return conv_u_1.i;
}

Assistant:

uint64_t HELPER(neon_qshl_s64)(CPUARMState *env, uint64_t valop, uint64_t shiftop)
{
    int8_t shift = (uint8_t)shiftop;
    int64_t val = valop;
    if (shift >= 64) {
        if (val) {
            SET_QC();
            val = (val >> 63) ^ ~SIGNBIT64;
        }
    } else if (shift <= -64) {
        val >>= 63;
    } else if (shift < 0) {
        val >>= -shift;
    } else {
        int64_t tmp = val;
        val <<= shift;
        if ((val >> shift) != tmp) {
            SET_QC();
            val = (tmp >> 63) ^ ~SIGNBIT64;
        }
    }
    return val;
}